

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveX(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *feastol,int start,int incr)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  type_conflict5 tVar4;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  cpp_dec_float<100U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  long lVar6;
  int local_234;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  local_1c8.m_backend.fpclass = cpp_dec_float_finite;
  local_1c8.m_backend.prec_elem = 0x10;
  local_1c8.m_backend.data._M_elems[0] = 0;
  local_1c8.m_backend.data._M_elems[1] = 0;
  local_1c8.m_backend.data._M_elems[2] = 0;
  local_1c8.m_backend.data._M_elems[3] = 0;
  local_1c8.m_backend.data._M_elems[4] = 0;
  local_1c8.m_backend.data._M_elems[5] = 0;
  local_1c8.m_backend.data._M_elems[6] = 0;
  local_1c8.m_backend.data._M_elems[7] = 0;
  local_1c8.m_backend.data._M_elems[0xc] = 0;
  local_1c8.m_backend.data._M_elems[0xd] = 0;
  local_1c8.m_backend.data._M_elems._56_5_ = 0;
  local_1c8.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_1c8.m_backend.exp = 0;
  local_1c8.m_backend.neg = false;
  local_1c8.m_backend.data._M_elems[8] = 0;
  local_1c8.m_backend.data._M_elems[9] = 0;
  local_1c8.m_backend.data._M_elems[10] = 0;
  local_1c8.m_backend.data._M_elems[0xb] = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  lVar6 = (long)start;
  a = (pSVar1->theCoTest).val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start + lVar6;
  v = &(pSVar1->coWeights).val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar6].m_backend;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_178,0,(type *)0x0);
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar3 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)incr;
  local_234 = -1;
  for (; lVar6 < (int)(((long)pnVar2 - (long)pnVar3) / 0x50); lVar6 = lVar6 + lVar5) {
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10)
    ;
    result.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
    result.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar4 = boost::multiprecision::operator<(a,&result);
    if (tVar4) {
      local_88 = *(undefined8 *)(a->m_backend).data._M_elems;
      uStack_80 = *(undefined8 *)((a->m_backend).data._M_elems + 2);
      local_78 = *(undefined8 *)((a->m_backend).data._M_elems + 4);
      uStack_70 = *(undefined8 *)((a->m_backend).data._M_elems + 6);
      local_68 = *(undefined8 *)((a->m_backend).data._M_elems + 8);
      uStack_60 = *(undefined8 *)((a->m_backend).data._M_elems + 10);
      local_58 = *(undefined8 *)((a->m_backend).data._M_elems + 0xc);
      uStack_50 = *(undefined8 *)((a->m_backend).data._M_elems + 0xe);
      local_48 = (a->m_backend).exp;
      local_44 = (a->m_backend).neg;
      local_40._0_4_ = (a->m_backend).fpclass;
      local_40._4_4_ = (a->m_backend).prec_elem;
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
      local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
      local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
      local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((v->data)._M_elems + 10);
      local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((v->data)._M_elems + 0xc);
      local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((v->data)._M_elems + 0xe);
      local_d8.m_backend.exp = v->exp;
      local_d8.m_backend.neg = v->neg;
      local_d8.m_backend.fpclass = v->fpclass;
      local_d8.m_backend.prec_elem = v->prec_elem;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_128.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_128.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_128.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_128.m_backend.exp = (feastol->m_backend).exp;
      local_128.m_backend.neg = (feastol->m_backend).neg;
      local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,(devexpr *)&local_88,&local_d8,&local_128,in_R8);
      local_1c8.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
      local_1c8.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
      local_1c8.m_backend.data._M_elems._56_5_ = result.m_backend.data._M_elems._56_5_;
      local_1c8.m_backend.data._M_elems[0xf]._1_3_ = result.m_backend.data._M_elems[0xf]._1_3_;
      local_1c8.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
      local_1c8.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
      local_1c8.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
      local_1c8.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
      local_1c8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_1c8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_1c8.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      local_1c8.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
      local_1c8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_1c8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_1c8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_1c8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_1c8.m_backend.exp = result.m_backend.exp;
      local_1c8.m_backend.neg = result.m_backend.neg;
      local_1c8.m_backend.fpclass = result.m_backend.fpclass;
      local_1c8.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar4 = boost::multiprecision::operator>
                        (&local_1c8,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_178);
      if (tVar4) {
        local_178.data._M_elems[0xf]._1_3_ = local_1c8.m_backend.data._M_elems[0xf]._1_3_;
        local_178.data._M_elems._56_5_ = local_1c8.m_backend.data._M_elems._56_5_;
        local_178.data._M_elems[0xc] = local_1c8.m_backend.data._M_elems[0xc];
        local_178.data._M_elems[0xd] = local_1c8.m_backend.data._M_elems[0xd];
        local_178.data._M_elems[8] = local_1c8.m_backend.data._M_elems[8];
        local_178.data._M_elems[9] = local_1c8.m_backend.data._M_elems[9];
        local_178.data._M_elems[10] = local_1c8.m_backend.data._M_elems[10];
        local_178.data._M_elems[0xb] = local_1c8.m_backend.data._M_elems[0xb];
        local_178.data._M_elems[4] = local_1c8.m_backend.data._M_elems[4];
        local_178.data._M_elems[5] = local_1c8.m_backend.data._M_elems[5];
        local_178.data._M_elems[6] = local_1c8.m_backend.data._M_elems[6];
        local_178.data._M_elems[7] = local_1c8.m_backend.data._M_elems[7];
        local_178.data._M_elems[0] = local_1c8.m_backend.data._M_elems[0];
        local_178.data._M_elems[1] = local_1c8.m_backend.data._M_elems[1];
        local_178.data._M_elems[2] = local_1c8.m_backend.data._M_elems[2];
        local_178.data._M_elems[3] = local_1c8.m_backend.data._M_elems[3];
        local_178.exp = local_1c8.m_backend.exp;
        local_178.neg = local_1c8.m_backend.neg;
        local_178.fpclass = local_1c8.m_backend.fpclass;
        local_178.prec_elem = local_1c8.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&(this->last).m_backend,v);
        local_234 = (int)lVar6;
      }
    }
    a = a + lVar5;
    v = v + lVar5;
  }
  return local_234;
}

Assistant:

int SPxDevexPR<R>::selectLeaveX(R feastol, int start, int incr)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int end = this->thesolver->coWeights.dim();

   for(; start < end; start += incr)
   {
      if(fTest[start] < -feastol)
      {
         x = devexpr::computePrice(fTest[start], cpen[start], feastol);

         if(x > best)
         {
            best = x;
            bstI = start;
            last = cpen[start];
         }
      }
   }

   return bstI;
}